

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_i4rescale(fitsfile *infptr,int naxis,long *naxes,double rescale,fitsfile *outfptr,int *status
                )

{
  bool bVar1;
  double dVar2;
  int local_88;
  int local_84;
  int local_7c;
  int checknull;
  int tstatus;
  int anynul;
  int nullvalue;
  int *intarray;
  long ny;
  long nx;
  long nelem;
  long jj;
  long ii;
  int *status_local;
  fitsfile *outfptr_local;
  double rescale_local;
  long *naxes_local;
  fitsfile *pfStack_18;
  int naxis_local;
  fitsfile *infptr_local;
  
  nx = 1;
  ny = *naxes;
  intarray = (int *)0x1;
  for (jj = 1; jj < naxis; jj = jj + 1) {
    intarray = (int *)((long)intarray * naxes[jj]);
  }
  ii = (long)status;
  status_local = &outfptr->HDUposition;
  outfptr_local = (fitsfile *)rescale;
  rescale_local = (double)naxes;
  naxes_local._4_4_ = naxis;
  pfStack_18 = infptr;
  _anynul = calloc(ny,4);
  if (_anynul == (void *)0x0) {
    *(undefined4 *)ii = 0x71;
    infptr_local._4_4_ = *(int *)ii;
  }
  else {
    local_7c = 0;
    ffgky(pfStack_18,0x1f,"BLANK",&tstatus,0,&local_7c);
    bVar1 = local_7c == 0;
    ffpscl(0x3ff0000000000000,pfStack_18,ii);
    ffpscl(0x3ff0000000000000,status_local,ii);
    for (jj = 0; jj < (long)intarray; jj = jj + 1) {
      ffgpvk(pfStack_18,1,nx,ny,0,_anynul,&checknull,ii);
      if (bVar1) {
        for (nelem = 0; nelem < ny; nelem = nelem + 1) {
          if (*(int *)((long)_anynul + nelem * 4) != tstatus) {
            if ((double)*(int *)((long)_anynul + nelem * 4) / (double)outfptr_local < 0.0) {
              dVar2 = (double)*(int *)((long)_anynul + nelem * 4) / (double)outfptr_local - 0.5;
            }
            else {
              dVar2 = (double)*(int *)((long)_anynul + nelem * 4) / (double)outfptr_local + 0.5;
            }
            local_84 = (int)dVar2;
            *(int *)((long)_anynul + nelem * 4) = local_84;
          }
        }
      }
      else {
        for (nelem = 0; nelem < ny; nelem = nelem + 1) {
          if ((double)*(int *)((long)_anynul + nelem * 4) / (double)outfptr_local < 0.0) {
            dVar2 = (double)*(int *)((long)_anynul + nelem * 4) / (double)outfptr_local - 0.5;
          }
          else {
            dVar2 = (double)*(int *)((long)_anynul + nelem * 4) / (double)outfptr_local + 0.5;
          }
          local_88 = (int)dVar2;
          *(int *)((long)_anynul + nelem * 4) = local_88;
        }
      }
      ffpprk(status_local,1,nx,ny,_anynul,ii);
      nx = ny + nx;
    }
    free(_anynul);
    infptr_local._4_4_ = *(int *)ii;
  }
  return infptr_local._4_4_;
}

Assistant:

int fp_i4rescale(fitsfile *infptr, int naxis, long *naxes, double rescale,
    fitsfile *outfptr, int *status)
{
/*
    divide the integer pixel values in the input file by rescale,
    and write back out to the output file..
*/

	long ii, jj, nelem = 1, nx, ny;
	int *intarray, nullvalue;
	int anynul, tstatus, checknull = 1;
	
	nx = naxes[0];
	ny = 1;
	
	for (ii = 1; ii < naxis; ii++) {
	    ny = ny * naxes[ii];
	}

	intarray = calloc(nx, sizeof(int));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TINT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   checknull = 0;
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr,  1.0, 0.0, status);
	fits_set_bscale(outfptr, 1.0, 0.0, status);

	for (ii = 0; ii < ny; ii++) {

	    fits_read_img_int(infptr, 1, nelem, nx,
	        0, intarray, &anynul, status);

	    if (checknull) {
	        for (jj = 0; jj < nx; jj++) {
	            if (intarray[jj] != nullvalue)
		        intarray[jj] = NINT( (intarray[jj] / rescale) );
		}
	    } else {
	        for (jj = 0; jj < nx; jj++)
		        intarray[jj] = NINT( (intarray[jj] / rescale) );
	    }

	    fits_write_img_int(outfptr, 1, nelem, nx, intarray, status);
	      
	    nelem += nx;
	}

	free(intarray);
	return(*status);
}